

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetLanguages
          (cmGeneratorTarget *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,string *config)

{
  size_type sVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  long lVar5;
  long lVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  _Alloc_hider _Var9;
  pointer ppcVar10;
  cmGeneratorTarget *tgt;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> objectLibraries;
  string objLib;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  cmGeneratorTarget *local_b0;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_a8;
  string local_88;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_68;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetSourceFiles(this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_48,config);
  ppcVar3 = local_48._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar7 = local_48._M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar3;
      ppcVar7 = ppcVar7 + 1) {
    cmSourceFile::GetLanguage_abi_cxx11_(&local_88,*ppcVar7);
    if ((pointer)local_88._M_string_length != (pointer)0x0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)languages,&local_88);
    }
    std::__cxx11::string::~string((string *)&local_88);
  }
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    GetObjectLibrariesCMP0026
              (this,(vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_88);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::reserve
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_a8,
               (long)(local_88._M_string_length - (long)local_88._M_dataplus._M_p) >> 3);
    sVar1 = local_88._M_string_length;
    for (_Var9._M_p = local_88._M_dataplus._M_p; _Var9._M_p != (pointer)sVar1;
        _Var9._M_p = _Var9._M_p + 8) {
      local_b0 = *(cmGeneratorTarget **)_Var9._M_p;
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_a8,
                 &local_b0);
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              ((_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_88)
    ;
    ppcVar10 = local_a8._M_impl.super__Vector_impl_data._M_start;
    ppcVar4 = local_a8._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    GetExternalObjects(this,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            &local_68,config);
    ppcVar2 = local_68._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar8 = local_68._M_impl.super__Vector_impl_data._M_start;
        ppcVar10 = local_a8._M_impl.super__Vector_impl_data._M_start,
        ppcVar4 = local_a8._M_impl.super__Vector_impl_data._M_finish, ppcVar8 != ppcVar2;
        ppcVar8 = ppcVar8 + 1) {
      cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_88,*ppcVar8);
      local_b0 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,&local_88);
      if (local_b0 != (cmGeneratorTarget *)0x0) {
        lVar5 = (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8._M_impl.super__Vector_impl_data._M_start;
        ppcVar4 = local_a8._M_impl.super__Vector_impl_data._M_start;
        for (lVar6 = lVar5 >> 5; 0 < lVar6; lVar6 = lVar6 + -1) {
          if (*ppcVar4 == local_b0) goto LAB_002bee2f;
          if (ppcVar4[1] == local_b0) {
            ppcVar4 = ppcVar4 + 1;
            goto LAB_002bee2f;
          }
          if (ppcVar4[2] == local_b0) {
            ppcVar4 = ppcVar4 + 2;
            goto LAB_002bee2f;
          }
          if (ppcVar4[3] == local_b0) {
            ppcVar4 = ppcVar4 + 3;
            goto LAB_002bee2f;
          }
          ppcVar4 = ppcVar4 + 4;
          lVar5 = lVar5 + -0x20;
        }
        lVar5 = lVar5 >> 3;
        if (lVar5 == 1) {
LAB_002bee16:
          if (*ppcVar4 != local_b0) {
            ppcVar4 = local_a8._M_impl.super__Vector_impl_data._M_finish;
          }
LAB_002bee2f:
          if (local_a8._M_impl.super__Vector_impl_data._M_finish != ppcVar4) goto LAB_002bee43;
        }
        else {
          if (lVar5 == 2) {
LAB_002bee0d:
            if (*ppcVar4 != local_b0) {
              ppcVar4 = ppcVar4 + 1;
              goto LAB_002bee16;
            }
            goto LAB_002bee2f;
          }
          if (lVar5 == 3) {
            if (*ppcVar4 != local_b0) {
              ppcVar4 = ppcVar4 + 1;
              goto LAB_002bee0d;
            }
            goto LAB_002bee2f;
          }
        }
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                  ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_a8,
                   &local_b0);
      }
LAB_002bee43:
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  for (; ppcVar10 != ppcVar4; ppcVar10 = ppcVar10 + 1) {
    GetLanguages(*ppcVar10,languages,config);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_68);
  std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
            (&local_a8);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void cmGeneratorTarget::GetLanguages(std::set<std::string>& languages,
                                     const std::string& config) const
{
  std::vector<cmSourceFile*> sourceFiles;
  this->GetSourceFiles(sourceFiles, config);
  for (cmSourceFile* src : sourceFiles) {
    const std::string& lang = src->GetLanguage();
    if (!lang.empty()) {
      languages.insert(lang);
    }
  }

  std::vector<cmGeneratorTarget*> objectLibraries;
  std::vector<cmSourceFile const*> externalObjects;
  if (!this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    std::vector<cmGeneratorTarget*> objectTargets;
    this->GetObjectLibrariesCMP0026(objectTargets);
    objectLibraries.reserve(objectTargets.size());
    for (cmGeneratorTarget* gt : objectTargets) {
      objectLibraries.push_back(gt);
    }
  } else {
    this->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* extObj : externalObjects) {
      std::string objLib = extObj->GetObjectLibrary();
      if (cmGeneratorTarget* tgt =
            this->LocalGenerator->FindGeneratorTargetToUse(objLib)) {
        auto const objLibIt =
          std::find_if(objectLibraries.cbegin(), objectLibraries.cend(),
                       [tgt](cmGeneratorTarget* t) { return t == tgt; });
        if (objectLibraries.cend() == objLibIt) {
          objectLibraries.push_back(tgt);
        }
      }
    }
  }
  for (cmGeneratorTarget* objLib : objectLibraries) {
    objLib->GetLanguages(languages, config);
  }
}